

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void prvTidyDropAttrByName(TidyDocImpl *doc,Node *node,ctmbstr name)

{
  AttVal *pAVar1;
  int iVar2;
  AttVal *next;
  AttVal *prev;
  AttVal *attr;
  ctmbstr name_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  next = (AttVal *)0x0;
  prev = node->attributes;
  while( true ) {
    if (prev == (AttVal *)0x0) {
      return;
    }
    pAVar1 = prev->next;
    if ((prev->attribute != (tmbstr)0x0) &&
       (iVar2 = prvTidytmbstrcmp(prev->attribute,name), iVar2 == 0)) break;
    next = prev;
    prev = pAVar1;
  }
  if (next == (AttVal *)0x0) {
    node->attributes = pAVar1;
  }
  else {
    next->next = pAVar1;
  }
  prvTidyFreeAttribute(doc,prev);
  return;
}

Assistant:

void TY_(DropAttrByName)( TidyDocImpl* doc, Node *node, ctmbstr name )
{
    AttVal *attr, *prev = NULL, *next;

    for (attr = node->attributes; attr != NULL; prev = attr, attr = next)
    {
        next = attr->next;

        if (attr->attribute && TY_(tmbstrcmp)(attr->attribute, name) == 0)
        {
            if (prev)
                 prev->next = next;
            else
                 node->attributes = next;

            TY_(FreeAttribute)( doc, attr ); 
            break;
        }
    }
}